

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O3

void __thiscall
Eigen::Matrix<float,-1,-1,0,4,4>::
Matrix<Eigen::internal::inverse_impl<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>>
          (Matrix<float,_1,_1,0,4,4> *this,
          ReturnByValue<Eigen::internal::inverse_impl<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>_>
          *other)

{
  ulong uVar1;
  PartialPivLU<Eigen::Matrix<float,__1,__1,_0,_4,_4>_> *local_d8;
  ulong local_d0;
  ulong local_c8;
  PartialPivLU<Eigen::Matrix<float,__1,__1,_0,_4,_4>_> local_b8;
  
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  if ((*(ulong *)(other + 0x40) < 5) && (uVar1 = *(ulong *)(other + 0x48), uVar1 < 5)) {
    *(ulong *)(this + 0x40) = *(ulong *)(other + 0x40);
    *(ulong *)(this + 0x48) = uVar1;
    PartialPivLU<Eigen::Matrix<float,_-1,_-1,_0,_4,_4>_>::PartialPivLU
              (&local_b8,(MatrixType *)other);
    if (local_b8.m_isInitialized == false) {
      __assert_fail("m_isInitialized && \"PartialPivLU is not initialized.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dilevin[P]computer-graphics-shader-pipeline/eigen/Eigen/src/LU/PartialPivLU.h"
                    ,0x94,
                    "const internal::solve_retval<PartialPivLU<MatrixType>, typename MatrixType::IdentityReturnType> Eigen::PartialPivLU<Eigen::Matrix<float, -1, -1, 0, 4, 4>>::inverse() const [MatrixType = Eigen::Matrix<float, -1, -1, 0, 4, 4>]"
                   );
    }
    if ((local_b8.m_lu.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>.m_storage.
         m_cols | local_b8.m_lu.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>.
                  m_storage.m_rows) < 0) {
      __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dilevin[P]computer-graphics-shader-pipeline/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                    ,0x3f,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>, Eigen::Matrix<float, -1, -1, 0, 4, 4>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_identity_op<float>, MatrixType = Eigen::Matrix<float, -1, -1, 0, 4, 4>]"
                   );
    }
    local_d0 = local_b8.m_lu.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>.m_storage
               .m_rows;
    local_c8 = local_b8.m_lu.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>.m_storage
               .m_cols;
    local_d8 = &local_b8;
    if ((ulong)local_b8.m_lu.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>.m_storage
               .m_cols < 5) {
      *(DenseIndex *)(this + 0x40) =
           local_b8.m_lu.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>.m_storage.
           m_cols;
      *(DenseIndex *)(this + 0x48) =
           local_b8.m_lu.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>.m_storage.
           m_cols;
      internal::
      solve_retval<Eigen::PartialPivLU<Eigen::Matrix<float,-1,-1,0,4,4>>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,-1,-1,0,4,4>>>
      ::evalTo<Eigen::Matrix<float,_1,_1,0,4,4>>
                ((solve_retval<Eigen::PartialPivLU<Eigen::Matrix<float,_1,_1,0,4,4>>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,_1,_1,0,4,4>>>
                  *)&local_d8,(Matrix<float,__1,__1,_0,_4,_4> *)this);
      return;
    }
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/dilevin[P]computer-graphics-shader-pipeline/eigen/Eigen/src/Core/PlainObjectBase.h"
                ,0xf1,
                "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, -1, 0, 4, 4>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, -1, 0, 4, 4>]"
               );
}

Assistant:

EIGEN_STRONG_INLINE Matrix& operator=(const EigenBase<OtherDerived> &other)
    {
      return Base::operator=(other);
    }